

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# com_util.c
# Opt level: O0

com_core_t * com_core_init(com_seqh_t *seqhdr)

{
  void *pvVar1;
  long lVar2;
  int local_4c;
  int alf_map_size;
  int alf_c_size;
  int alf_l_size;
  int sao_map_size;
  int sao_c_size;
  int sao_l_size;
  com_core_t *core;
  com_map_t *map;
  u8 *buf;
  int total_mem_size;
  com_seqh_t *seqhdr_local;
  
  seqhdr_local = (com_seqh_t *)align_malloc(0x47e8);
  sao_map_size = 0;
  alf_l_size = 0;
  alf_c_size = 0;
  alf_map_size = 0;
  local_4c = 0;
  if (seqhdr_local == (com_seqh_t *)0x0) {
    seqhdr_local = (com_seqh_t *)0x0;
  }
  else {
    buf._4_4_ = seqhdr->f_scu + seqhdr->f_scu + seqhdr->f_scu * 4 + seqhdr->f_scu + seqhdr->f_lcu +
                seqhdr->f_lcu + seqhdr->pic_width * 2 + seqhdr->pic_width * 2 + 0x158;
    if (seqhdr->sample_adaptive_offset_enable_flag != '\0') {
      sao_map_size = seqhdr->pic_width + 0x4643;
      alf_l_size = (seqhdr->pic_width / 2 + 0x1343) * 2;
      alf_c_size = seqhdr->f_lcu * 0x84;
      buf._4_4_ = sao_map_size + alf_l_size + alf_c_size + 0x5d + buf._4_4_;
    }
    if (seqhdr->adaptive_leveling_filter_enable_flag != '\0') {
      alf_map_size = seqhdr->pic_width + 0x52c0;
      local_4c = (seqhdr->pic_width / 2 + 0x19c0) * 2;
      buf._4_4_ = alf_map_size + local_4c + seqhdr->f_lcu * 3 + 0x5d + buf._4_4_;
    }
    pvVar1 = align_malloc(buf._4_4_);
    *(void **)(seqhdr_local[3].rpls_l0[5].delta_doi + 8) = pvVar1;
    if (pvVar1 == (void *)0x0) {
      if (seqhdr_local != (com_seqh_t *)0x0) {
        align_free(seqhdr_local);
      }
      seqhdr_local = (com_seqh_t *)0x0;
    }
    else {
      lVar2 = (long)pvVar1 + (0x1f - ((long)pvVar1 + 0x1fU & 0x1f));
      *(long *)(seqhdr_local[3].rpls_l0[5].delta_doi + 10) = lVar2;
      lVar2 = seqhdr->f_scu + lVar2;
      lVar2 = (lVar2 + 0x1f) - (lVar2 + 0x1fU & 0x1f);
      memset(*(void **)(seqhdr_local[3].rpls_l0[5].delta_doi + 10),0,(long)seqhdr->f_scu);
      *(long *)(seqhdr_local[3].rpls_l0[5].delta_doi + 10) =
           *(long *)(seqhdr_local[3].rpls_l0[5].delta_doi + 10) + (long)(seqhdr->i_scu + 1);
      *(long *)(seqhdr_local[3].rpls_l0[5].delta_doi + 0x10) = lVar2;
      lVar2 = seqhdr->f_scu + lVar2;
      lVar2 = (lVar2 + 0x1f) - (lVar2 + 0x1fU & 0x1f);
      *(long *)(seqhdr_local[3].rpls_l0[5].delta_doi + 0x10) =
           *(long *)(seqhdr_local[3].rpls_l0[5].delta_doi + 0x10) + (long)(seqhdr->i_scu + 1);
      *(long *)(seqhdr_local[3].rpls_l0[5].delta_doi + 0xc) = lVar2;
      lVar2 = (long)seqhdr->f_scu * 4 + lVar2;
      lVar2 = (lVar2 + 0x1f) - (lVar2 + 0x1fU & 0x1f);
      *(long *)(seqhdr_local[3].rpls_l0[5].delta_doi + 0xc) =
           *(long *)(seqhdr_local[3].rpls_l0[5].delta_doi + 0xc) + (long)(seqhdr->i_scu + 1) * 4;
      *(long *)(seqhdr_local[3].rpls_l0[5].delta_doi + 0xe) = lVar2;
      lVar2 = seqhdr->f_scu + lVar2;
      lVar2 = (lVar2 + 0x1f) - (lVar2 + 0x1fU & 0x1f);
      memset(*(void **)(seqhdr_local[3].rpls_l0[5].delta_doi + 0xe),0,(long)seqhdr->f_scu);
      *(long *)(seqhdr_local[3].rpls_l0[5].delta_doi + 0xe) =
           *(long *)(seqhdr_local[3].rpls_l0[5].delta_doi + 0xe) + (long)(seqhdr->i_scu + 1);
      *(long *)&seqhdr_local[3].rpls_l0[6].active = lVar2;
      lVar2 = seqhdr->f_lcu + lVar2;
      lVar2 = (lVar2 + 0x1f) - (lVar2 + 0x1fU & 0x1f);
      *(long *)(seqhdr_local[3].rpls_l0[6].delta_doi + 1) = lVar2;
      lVar2 = seqhdr->f_lcu + lVar2;
      lVar2 = (lVar2 + 0x1f) - (lVar2 + 0x1fU & 0x1f);
      *(long *)(seqhdr_local[3].rpls_l0[6].delta_doi + 0xb) = lVar2;
      lVar2 = seqhdr->pic_width + lVar2;
      lVar2 = (lVar2 + 0x1f) - (lVar2 + 0x1fU & 0x1f);
      *(long *)(seqhdr_local[3].rpls_l0[6].delta_doi + 0xd) = lVar2;
      lVar2 = seqhdr->pic_width + lVar2;
      lVar2 = (lVar2 + 0x1f) - (lVar2 + 0x1fU & 0x1f);
      *(long *)(seqhdr_local[3].rpls_l0[6].delta_doi + 0xf) = lVar2;
      lVar2 = (seqhdr->pic_width + 1) + lVar2;
      lVar2 = (lVar2 + 0x1f) - (lVar2 + 0x1fU & 0x1f);
      *(long *)(seqhdr_local[3].rpls_l0[6].delta_doi + 0xf) =
           *(long *)(seqhdr_local[3].rpls_l0[6].delta_doi + 0xf) + 1;
      *(long *)(seqhdr_local[3].rpls_l0 + 7) = lVar2;
      lVar2 = (seqhdr->pic_width + 2) + lVar2;
      map = (com_map_t *)((lVar2 + 0x1f) - (lVar2 + 0x1fU & 0x1f));
      *(long *)(seqhdr_local[3].rpls_l0 + 7) = *(long *)(seqhdr_local[3].rpls_l0 + 7) + 2;
      if (seqhdr->sample_adaptive_offset_enable_flag != '\0') {
        *(com_map_t **)seqhdr_local[3].rpls_l0[7].delta_doi = map;
        lVar2 = (long)map +
                (((long)sao_map_size + 0x1f) -
                ((long)&map->map_edge + (long)sao_map_size + 7 & 0x1fU));
        *(long *)(seqhdr_local[3].rpls_l0[7].delta_doi + 2) = lVar2;
        lVar2 = lVar2 + alf_l_size;
        lVar2 = (lVar2 + 0x1f) - (lVar2 + 0x1fU & 0x1f);
        *(long *)(seqhdr_local[3].rpls_l0[6].delta_doi + 7) = lVar2;
        lVar2 = lVar2 + alf_c_size;
        map = (com_map_t *)((lVar2 + 0x1f) - (lVar2 + 0x1fU & 0x1f));
      }
      if (seqhdr->adaptive_leveling_filter_enable_flag != '\0') {
        *(com_map_t **)(seqhdr_local[3].rpls_l0[7].delta_doi + 4) = map;
        lVar2 = (long)map +
                (((long)alf_map_size + 0x1f) -
                ((long)&map->map_edge + (long)alf_map_size + 7 & 0x1fU));
        *(long *)(seqhdr_local[3].rpls_l0[7].delta_doi + 6) = lVar2;
        lVar2 = lVar2 + local_4c;
        *(ulong *)(seqhdr_local[3].rpls_l0[6].delta_doi + 9) =
             (lVar2 + 0x1f) - (lVar2 + 0x1fU & 0x1f);
      }
    }
  }
  return (com_core_t *)seqhdr_local;
}

Assistant:

com_core_t* com_core_init(com_seqh_t *seqhdr)
{
    int total_mem_size = 0;
    u8 *buf;
    com_map_t *map;
    com_core_t *core = com_malloc(sizeof(com_core_t));
    int sao_l_size = 0, sao_c_size = 0, sao_map_size = 0;
    int alf_l_size = 0, alf_c_size = 0, alf_map_size = 0;

    if (core == NULL) {
        return NULL;
    }

    map = &core->map;

    total_mem_size = ALIGN_MASK     + sizeof(com_scu_t) * seqhdr->f_scu +             // map_scu
                     ALIGN_MASK     + sizeof(       s8) * seqhdr->f_scu +             // map_ipm
                     ALIGN_MASK     + sizeof(      u32) * seqhdr->f_scu +             // map_pos
                     ALIGN_MASK     + sizeof(       u8) * seqhdr->f_scu +             // map_edge
                     ALIGN_MASK     + sizeof(       s8) * seqhdr->f_lcu +             // map_patch
                     ALIGN_MASK     + sizeof(       s8) * seqhdr->f_lcu +             // map_qp
                     ALIGN_MASK * 2 + sizeof(pel) * seqhdr->pic_width * 2 +           // linebuf_intra
                     ALIGN_MASK * 2 + sizeof(pel) * (seqhdr->pic_width * 2 + 3) +     // linebuf_sao
                     ALIGN_MASK;

    if (seqhdr->sample_adaptive_offset_enable_flag) {
        sao_l_size   = sizeof(pel) * ((MAX_CU_SIZE + SAO_SHIFT_PIX_NUM + 2) * (MAX_CU_SIZE + SAO_SHIFT_PIX_NUM + 2) + seqhdr->pic_width + ALIGN_MASK);
        sao_c_size   = sizeof(pel) * ((MAX_CU_SIZE / 2 + SAO_SHIFT_PIX_NUM + 2) * (MAX_CU_SIZE / 2 + SAO_SHIFT_PIX_NUM + 2) + seqhdr->pic_width / 2 + ALIGN_MASK) * 2;
        sao_map_size = sizeof(com_sao_param_t) * N_C * seqhdr->f_lcu;
        total_mem_size += sao_l_size + sao_c_size + sao_map_size + ALIGN_MASK * 3;
    }
    if (seqhdr->adaptive_leveling_filter_enable_flag) {
        alf_l_size = sizeof(pel) * ((MAX_CU_SIZE + ALIGN_BASIC) * (MAX_CU_SIZE + 4) + seqhdr->pic_width + ALIGN_BASIC * 2);
        alf_c_size = sizeof(pel) * ((MAX_CU_SIZE / 2 + ALIGN_BASIC) * (MAX_CU_SIZE / 2 + 4) + seqhdr->pic_width / 2 + ALIGN_BASIC * 2) * 2;
        alf_map_size = sizeof(u8) * N_C * seqhdr->f_lcu;
        total_mem_size += alf_l_size + alf_c_size + alf_map_size + ALIGN_MASK * 3;
    }

    map->map_base = buf = com_malloc(total_mem_size);

    if (buf == NULL) {
        com_free(core);
        return NULL;
    }

    buf = ALIGN_POINTER(buf);
    GIVE_BUFFERV(map->map_scu,    buf, sizeof(com_scu_t) * seqhdr->f_scu, 0);   map->map_scu    += seqhdr->i_scu + 1;
    GIVE_BUFFER (map->map_ipm,    buf, sizeof(       s8) * seqhdr->f_scu   );   map->map_ipm    += seqhdr->i_scu + 1;
    GIVE_BUFFER (map->map_pos,    buf, sizeof(      u32) * seqhdr->f_scu   );   map->map_pos    += seqhdr->i_scu + 1;
    GIVE_BUFFERV(map->map_edge,   buf, sizeof(       u8) * seqhdr->f_scu, 0);   map->map_edge   += seqhdr->i_scu + 1;

    GIVE_BUFFER(map->map_patch,  buf, sizeof( s8) * seqhdr->f_lcu);
    GIVE_BUFFER(map->map_qp,     buf, sizeof( s8) * seqhdr->f_lcu);

    GIVE_BUFFER(core->linebuf_intra[0], buf, sizeof(pel) *  seqhdr->pic_width);
    GIVE_BUFFER(core->linebuf_intra[1], buf, sizeof(pel) *  seqhdr->pic_width);
    GIVE_BUFFER(core->linebuf_sao  [0], buf, sizeof(pel) * (seqhdr->pic_width + 1)); core->linebuf_sao[0] += 1;
    GIVE_BUFFER(core->linebuf_sao  [1], buf, sizeof(pel) * (seqhdr->pic_width + 2)); core->linebuf_sao[1] += 2;

    if (seqhdr->sample_adaptive_offset_enable_flag) {
        GIVE_BUFFER(core->sao_src_buf[0], buf, sao_l_size);
        GIVE_BUFFER(core->sao_src_buf[1], buf, sao_c_size);
        GIVE_BUFFER(core->sao_param_map,  buf, sao_map_size);
    }
    if (seqhdr->adaptive_leveling_filter_enable_flag) {
        GIVE_BUFFER(core->alf_src_buf[0], buf, alf_l_size);
        GIVE_BUFFER(core->alf_src_buf[1], buf, alf_c_size);
        GIVE_BUFFER(core->alf_enable_map, buf, alf_map_size);
    }
    return core;
}